

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O3

gotcha_error_t
get_configuration_value(char *tool_name,gotcha_config_key_t key,void *location_to_store_result)

{
  int iVar1;
  tool_t *ptVar2;
  gotcha_error_t gVar3;
  
  ptVar2 = get_tool(tool_name);
  if (ptVar2 == (tool_t *)0x0) {
    gVar3 = GOTCHA_INVALID_TOOL;
    if (debug_level != 0) {
      get_configuration_value_cold_2();
    }
  }
  else if (key == GOTCHA_PRIORITY) {
    *(undefined4 *)location_to_store_result = 0xffffffff;
    do {
      iVar1 = (ptVar2->config).priority;
      if (iVar1 != -1) {
        *(int *)location_to_store_result = iVar1;
        break;
      }
      ptVar2 = ptVar2->parent_tool;
    } while (ptVar2 != (tool_t *)0x0);
    gVar3 = GOTCHA_SUCCESS;
  }
  else {
    gVar3 = GOTCHA_INTERNAL;
    if (debug_level != 0) {
      get_configuration_value_cold_1();
    }
  }
  return gVar3;
}

Assistant:

enum gotcha_error_t get_configuration_value(const char* tool_name, enum gotcha_config_key_t key, void* location_to_store_result){
  struct tool_t* tool = get_tool(tool_name);
  if(tool==NULL){
     error_printf("Property being examined for nonexistent tool %s\n", tool_name);
     return GOTCHA_INVALID_TOOL;
  }
  get_default_configuration_value(key, location_to_store_result);
  int found_valid_value = 0;
  while( (tool!=NULL) && !(found_valid_value) ){
    struct gotcha_configuration_t config = tool->config;
    if(key==GOTCHA_PRIORITY){
      int current_priority = config.priority;
      if(current_priority!=UNSET_PRIORITY){
        *((int*)(location_to_store_result)) = config.priority; 
        found_valid_value = 1;
        return GOTCHA_SUCCESS;
      }
    }
    else{
      error_printf("Invalid property being configured on tool %s\n", tool_name);
      return GOTCHA_INTERNAL;
    }
    tool = tool->parent_tool;
  }
  return GOTCHA_SUCCESS;  
}